

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward8.c
# Opt level: O2

void frssort1(string *strings,size_t scnt)

{
  byte bVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  group pgVar5;
  undefined8 uVar6;
  int iVar7;
  group_conflict pgVar8;
  uint uVar9;
  list_conflict __ptr;
  group_conflict pgVar10;
  group pgVar11;
  list r;
  undefined8 *puVar12;
  size_t sVar13;
  int size;
  ulong uVar14;
  list_conflict plVar15;
  bool bVar16;
  list_conflict plVar17;
  list_conflict tail;
  undefined8 *puVar18;
  character ch;
  group_conflict pgVar19;
  long lVar20;
  group_conflict g;
  long local_60;
  
  __ptr = (list_conflict)calloc(scnt,0x18);
  plVar15 = __ptr;
  for (uVar14 = 0; scnt != uVar14; uVar14 = uVar14 + 1) {
    plVar17 = (list_conflict)0x0;
    if (uVar14 < scnt - 1) {
      plVar17 = plVar15 + 1;
    }
    plVar15->str = strings[uVar14];
    plVar15->next = plVar17;
    plVar15 = plVar15 + 1;
  }
  plVar15 = __ptr;
  if (1 < (int)scnt) {
    local_60 = 0;
    initmem(groupmem,0x30,(int)((scnt & 0xffffffff) / 0xf));
    initmem(bucketmem,0x28,(int)((scnt & 0xffffffff) / 5));
    pgVar10 = (group_conflict)allocmem(groupmem,0x30);
    pgVar11 = (group)allocmem(groupmem,0x30);
    pgVar10->nextunf = pgVar11;
    pgVar10->next = pgVar11;
    pgVar11->head = __ptr;
    pgVar11->finis = 0;
    pgVar11->next = (group)0x0;
    pgVar11->nextunf = (group)0x0;
    do {
      resetmem(bucketmem);
      g = pgVar10;
      pgVar8 = pgVar10;
LAB_002214d1:
      pgVar19 = pgVar8;
      g = g->nextunf;
      if (g != (group_conflict)0x0) {
        if (g->finis == 0) {
          bVar16 = true;
          plVar15 = g->head;
          uVar9 = (uint)g->head->str[local_60];
          do {
            plVar17 = plVar15;
            iVar7 = 1;
            do {
              size = iVar7;
              tail = plVar17;
              plVar17 = tail->next;
              if (plVar17 == (list_conflict)0x0) {
                pgVar8 = g;
                if (bVar16) {
                  if (uVar9 != 0) goto LAB_002214d1;
                  goto LAB_0022154b;
                }
                intobucket((bucket_conflict *)(&forward1_b + uVar9),plVar15,tail,size,g);
                g->head = (list_conflict)0x0;
                goto LAB_002214d1;
              }
              bVar1 = plVar17->str[local_60];
              iVar7 = size + 1;
            } while (uVar9 == bVar1);
            intobucket((bucket_conflict *)(&forward1_b + uVar9),plVar15,tail,size,g);
            g->head = plVar17;
            bVar16 = false;
            plVar15 = plVar17;
            uVar9 = (uint)bVar1;
          } while( true );
        }
LAB_0022154b:
        pgVar19->nextunf = g->nextunf;
        pgVar8 = pgVar19;
        goto LAB_002214d1;
      }
      if (pgVar10->nextunf == (group)0x0) goto LAB_00221692;
      local_60 = local_60 + 1;
      for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 1) {
        puVar18 = (undefined8 *)(&forward1_b)[lVar20];
        if (puVar18 != (undefined8 *)0x0) {
          for (; puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)puVar18[4]) {
            if ((lVar20 == 0) || (0x13 < *(int *)(puVar18 + 2))) {
              r = (list)*puVar18;
              uVar9 = (uint)(lVar20 == 0);
            }
            else {
              r = (list)*puVar18;
              if (1 < *(int *)(puVar18 + 2)) {
                r = ListInsertsort(r,(list_conflict *)(puVar18 + 1),(int)local_60);
                *puVar18 = r;
              }
              uVar9 = 1;
            }
            lVar2 = puVar18[1];
            plVar3 = (long *)puVar18[3];
            if (*plVar3 == 0) {
              *plVar3 = (long)r;
              plVar3[1] = lVar2;
              *(uint *)(plVar3 + 5) = uVar9;
              plVar3[4] = (long)plVar3;
            }
            else if ((uVar9 == 0) || (lVar4 = plVar3[4], *(int *)(lVar4 + 0x28) == 0)) {
              puVar12 = (undefined8 *)allocmem(groupmem,0x30);
              *puVar12 = r;
              puVar12[1] = lVar2;
              lVar2 = plVar3[4];
              uVar6 = *(undefined8 *)(lVar2 + 0x18);
              puVar12[2] = *(undefined8 *)(lVar2 + 0x10);
              puVar12[3] = uVar6;
              *(uint *)(puVar12 + 5) = uVar9;
              *(undefined8 **)(lVar2 + 0x10) = puVar12;
              *(undefined8 **)(lVar2 + 0x18) = puVar12;
              plVar3[4] = (long)puVar12;
            }
            else {
              *(list *)(*(long *)(lVar4 + 8) + 8) = r;
              *(long *)(lVar4 + 8) = lVar2;
            }
          }
          (&forward1_b)[lVar20] = 0;
        }
      }
    } while( true );
  }
LAB_002216de:
  for (sVar13 = 0; scnt != sVar13; sVar13 = sVar13 + 1) {
    strings[sVar13] = plVar15->str;
    plVar15 = plVar15->next;
  }
  free(__ptr);
  return;
LAB_00221692:
  plVar15 = pgVar10->next->head;
  pgVar11 = pgVar10->next;
  while (pgVar5 = pgVar11->next, pgVar5 != (group)0x0) {
    pgVar11->tail->next = pgVar5->head;
    pgVar11 = pgVar5;
  }
  freemem(bucketmem);
  freemem(groupmem);
  goto LAB_002216de;
}

Assistant:

void frssort1(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward1(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}